

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> * __thiscall
asl::Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal>::resize
          (Array<asl::Map<asl::String,_asl::Dic<asl::String>_>::KeyVal> *this,int m)

{
  int iVar1;
  int n;
  
  iVar1 = *(int *)((long)&this->_a[-1].key.field_2 + 8);
  reserve(this,m);
  if (iVar1 < m) {
    asl_construct<asl::Map<asl::String,asl::Dic<asl::String>>::KeyVal>
              ((asl *)(this->_a + iVar1),(KeyVal *)(ulong)(uint)(m - iVar1),n);
  }
  else if (m < iVar1) {
    asl_destroy<asl::Map<asl::String,asl::Dic<asl::String>>::KeyVal>
              ((asl *)(this->_a + m),(KeyVal *)(ulong)(uint)(iVar1 - m),n);
  }
  *(int *)((long)&this->_a[-1].key.field_2 + 8) = m;
  return this;
}

Assistant:

Array& resize(int m)
	{
		int n = d().n;
		reserve(m);
		if (m > n)
			asl_construct(_a + n, m - n);
		else if (m < n)
			asl_destroy(_a + m, n - m);
		d().n = m;
		return *this;
	}